

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O3

bool __thiscall camp::UserObject::operator<(UserObject *this,UserObject *other)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  do {
    peVar1 = (((ParentObject *)this)->object).m_holder.
             super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      if ((((ParentObject *)other)->object).m_holder.
          super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        iVar2 = (*peVar1->_vptr_AbstractObjectHolder[2])(peVar1);
        iVar3 = (*((((ParentObject *)other)->object).m_holder.
                   super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_AbstractObjectHolder[2])();
        return CONCAT44(extraout_var,iVar2) < CONCAT44(extraout_var_00,iVar3);
      }
LAB_0011ba12:
      return (((ParentObject *)other)->object).m_parent.px != (ParentObject *)0x0;
    }
    this = &((((ParentObject *)this)->object).m_parent.px)->object;
    if ((ParentObject *)this == (ParentObject *)0x0) {
      if ((((ParentObject *)other)->object).m_holder.
          super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        return true;
      }
      goto LAB_0011ba12;
    }
    other = &((scoped_ptr<camp::ParentObject> *)((long)&((ParentObject *)other)->object + 0x18))->px
             ->object;
    if ((ParentObject *)other == (ParentObject *)0x0) {
      return false;
    }
    if (((ParentObject *)this)->member != ((ParentObject *)other)->member) {
      return ((ParentObject *)this)->member < ((ParentObject *)other)->member;
    }
  } while( true );
}

Assistant:

bool UserObject::operator<(const UserObject& other) const
{
    if (m_holder)
    {
        if (other.m_holder)
        {
            return m_holder->object() < other.m_holder->object();
        }
        else
        {
            return other.m_parent != 0;
        }
    }
    else if (m_parent)
    {
        if (other.m_parent)
        {
            if (&m_parent->member != &other.m_parent->member)
                return &m_parent->member < &other.m_parent->member;
            else
                return m_parent->object < other.m_parent->object;
        }
        else
        {
            return false;
        }
    }
    else
    {
        return other.m_holder || other.m_parent;
    }
}